

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_kfold_int64arith(jit_State *J)

{
  TRef TVar1;
  uint64_t u64;
  IROp in_ECX;
  
  u64 = kfold_int64arith((jit_State *)(J->fold).left[1],(uint64_t)(J->fold).right[1],
                         (ulong)(J->fold).ins.field_1.o,in_ECX);
  TVar1 = lj_ir_kint64(J,u64);
  return TVar1;
}

Assistant:

static uint64_t kfold_int64arith(jit_State *J, uint64_t k1, uint64_t k2,
				 IROp op)
{
  UNUSED(J);
#if LJ_HASFFI
  switch (op) {
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
  case IR_MUL: k1 *= k2; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
  case IR_BSHL: k1 <<= (k2 & 63); break;
  case IR_BSHR: k1 = (int32_t)((uint32_t)k1 >> (k2 & 63)); break;
  case IR_BSAR: k1 >>= (k2 & 63); break;
  case IR_BROL: k1 = (int32_t)lj_rol((uint32_t)k1, (k2 & 63)); break;
  case IR_BROR: k1 = (int32_t)lj_ror((uint32_t)k1, (k2 & 63)); break;
  default: lj_assertJ(0, "bad IR op %d", op); break;
  }
#else
  UNUSED(k2); UNUSED(op);
  lj_assertJ(0, "FFI IR op without FFI");
#endif
  return k1;
}